

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O3

_Bool cf_hc_data_pending(Curl_cfilter *cf,Curl_easy *data)

{
  int *piVar1;
  long *plVar2;
  int *piVar3;
  char cVar4;
  _Bool _Var5;
  ulong uVar6;
  ulong uVar7;
  
  if ((cf->field_0x24 & 1) != 0) {
    _Var5 = (*cf->next->cft->has_data_pending)(cf->next,data);
    return _Var5;
  }
  piVar1 = (int *)cf->ctx;
  uVar6 = *(ulong *)(piVar1 + 0x26);
  if (uVar6 != 0) {
    uVar7 = 0;
    piVar3 = piVar1;
    do {
      plVar2 = *(long **)(piVar3 + 0xc);
      if ((plVar2 != (long *)0x0) && (piVar3[0xe] == 0)) {
        cVar4 = (**(code **)(*plVar2 + 0x40))(plVar2,data);
        if (cVar4 != '\0') {
          return true;
        }
        uVar6 = *(ulong *)(piVar1 + 0x26);
      }
      uVar7 = uVar7 + 1;
      piVar3 = piVar3 + 0xe;
    } while (uVar7 < uVar6);
  }
  return false;
}

Assistant:

static bool cf_hc_data_pending(struct Curl_cfilter *cf,
                               const struct Curl_easy *data)
{
  struct cf_hc_ctx *ctx = cf->ctx;
  size_t i;

  if(cf->connected)
    return cf->next->cft->has_data_pending(cf->next, data);

  for(i = 0; i < ctx->baller_count; i++)
    if(cf_hc_baller_data_pending(&ctx->ballers[i], data))
      return TRUE;
  return FALSE;
}